

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLutmin.c
# Opt level: O3

int Abc_ObjCheckAbsorb(Abc_Obj_t *pObj,Abc_Obj_t *pPivot,int nLutSize,Vec_Ptr_t *vFanins)

{
  size_t sVar1;
  Abc_Obj_t *pAVar2;
  void *pvVar3;
  int iVar4;
  void **ppvVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  
  if (((*(uint *)&pObj->field_0x14 & 0xf) != 7) || ((*(uint *)&pPivot->field_0x14 & 0xf) != 7)) {
    __assert_fail("Abc_ObjIsNode(pObj) && Abc_ObjIsNode(pPivot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLutmin.c"
                  ,0x3d,"int Abc_ObjCheckAbsorb(Abc_Obj_t *, Abc_Obj_t *, int, Vec_Ptr_t *)");
  }
  vFanins->nSize = 0;
  iVar4 = (pObj->vFanins).nSize;
  uVar7 = 0;
  if (0 < iVar4) {
    lVar8 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar8]];
      if (pAVar2 != pPivot) {
        if (uVar7 == vFanins->nCap) {
          if ((int)uVar7 < 0x10) {
            if (vFanins->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(vFanins->pArray,0x80);
            }
            vFanins->pArray = ppvVar5;
            vFanins->nCap = 0x10;
          }
          else {
            sVar1 = (ulong)(uVar7 * 2) * 8;
            if (vFanins->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(sVar1);
            }
            else {
              ppvVar5 = (void **)realloc(vFanins->pArray,sVar1);
            }
            vFanins->pArray = ppvVar5;
            vFanins->nCap = uVar7 * 2;
          }
        }
        else {
          ppvVar5 = vFanins->pArray;
        }
        iVar4 = vFanins->nSize;
        uVar7 = iVar4 + 1;
        vFanins->nSize = uVar7;
        ppvVar5[iVar4] = pAVar2;
        iVar4 = (pObj->vFanins).nSize;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar4);
  }
  if (0 < (pPivot->vFanins).nSize) {
    lVar8 = 0;
    do {
      pvVar3 = pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar8]];
      if (0 < (int)uVar7) {
        uVar6 = 0;
        do {
          if (vFanins->pArray[uVar6] == pvVar3) goto LAB_0026a0ff;
          uVar6 = uVar6 + 1;
        } while (uVar7 != uVar6);
      }
      if (uVar7 == vFanins->nCap) {
        if ((int)uVar7 < 0x10) {
          if (vFanins->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(vFanins->pArray,0x80);
          }
          vFanins->pArray = ppvVar5;
          vFanins->nCap = 0x10;
        }
        else {
          sVar1 = (ulong)(uVar7 * 2) * 8;
          if (vFanins->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(sVar1);
          }
          else {
            ppvVar5 = (void **)realloc(vFanins->pArray,sVar1);
          }
          vFanins->pArray = ppvVar5;
          vFanins->nCap = uVar7 * 2;
        }
      }
      else {
        ppvVar5 = vFanins->pArray;
      }
      iVar4 = vFanins->nSize;
      uVar7 = iVar4 + 1;
      vFanins->nSize = uVar7;
      ppvVar5[iVar4] = pvVar3;
LAB_0026a0ff:
      if (nLutSize < (int)uVar7) {
        return 0;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (pPivot->vFanins).nSize);
  }
  return 1;
}

Assistant:

int Abc_ObjCheckAbsorb( Abc_Obj_t * pObj, Abc_Obj_t * pPivot, int nLutSize, Vec_Ptr_t * vFanins )
{
    Abc_Obj_t * pFanin;
    int i;
    assert( Abc_ObjIsNode(pObj) && Abc_ObjIsNode(pPivot) );
    // add fanins of the node
    Vec_PtrClear( vFanins );
    Abc_ObjForEachFanin( pObj, pFanin, i )
        if ( pFanin != pPivot )
            Vec_PtrPush( vFanins, pFanin );
    // add fanins of the fanin
    Abc_ObjForEachFanin( pPivot, pFanin, i )
    {
        Vec_PtrPushUnique( vFanins, pFanin );
        if ( Vec_PtrSize(vFanins) > nLutSize )
            return 0;
    }
    return 1;
}